

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_dpsub_s_df(uint32_t df,int64_t dest,int64_t arg1,int64_t arg2)

{
  char cVar1;
  int64_t odd_arg2;
  int64_t odd_arg1;
  int64_t even_arg2;
  int64_t even_arg1;
  int64_t arg2_local;
  int64_t arg1_local;
  int64_t dest_local;
  uint32_t df_local;
  
  cVar1 = (char)df;
  return dest - (((arg1 << (0x40U - (char)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1) & 0x3f)) >>
                 (0x40U - (char)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1) & 0x3f)) *
                 ((arg2 << (0x40U - (char)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1) & 0x3f)) >>
                 (0x40U - (char)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1) & 0x3f)) +
                ((arg1 << (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f)) >>
                (0x40U - (char)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1) & 0x3f)) *
                ((arg2 << (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f)) >>
                (0x40U - (char)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1) & 0x3f)));
}

Assistant:

static inline int64_t msa_dpsub_s_df(uint32_t df, int64_t dest, int64_t arg1,
                                     int64_t arg2)
{
    int64_t even_arg1;
    int64_t even_arg2;
    int64_t odd_arg1;
    int64_t odd_arg2;
    SIGNED_EXTRACT(even_arg1, odd_arg1, arg1, df);
    SIGNED_EXTRACT(even_arg2, odd_arg2, arg2, df);
    return dest - ((even_arg1 * even_arg2) + (odd_arg1 * odd_arg2));
}